

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O3

void printNEONModImmOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *op;
  ulong uVar5;
  byte bVar6;
  long lVar7;
  undefined4 in_register_00000034;
  char *fmt;
  ulong uVar8;
  
  op = MCInst_getOperand(MI,1);
  uVar5 = MCOperand_getImm(op);
  uVar4 = (uint)uVar5;
  uVar3 = (uint)(uVar5 >> 8);
  if ((uVar3 & 0x1f) == 0xe) {
    uVar5 = uVar5 & 0xff;
    goto LAB_0015e1f2;
  }
  if ((uVar4 & 0xc00) == 0x800) {
    uVar3 = uVar3 & 0xffffc2;
LAB_0015e1ed:
    uVar5 = (uVar5 & 0xff) << (sbyte)(uVar3 << 2);
LAB_0015e1f2:
    if (9 < uVar5) {
      fmt = "#0x%lx";
      goto LAB_0015e26e;
    }
  }
  else {
    if ((uVar4 >> 0xb & 1) == 0) {
      uVar3 = uVar3 & 0xffffc6;
      goto LAB_0015e1ed;
    }
    if ((uVar4 & 0xe00) == 0xc00) {
      bVar6 = (byte)((uVar3 & 1) << 3);
      uVar5 = (ulong)(0xffffU >> (bVar6 ^ 8) | (uVar4 & 0xff) << bVar6 + 8);
      goto LAB_0015e1f2;
    }
    if ((uVar3 & 0x1f) == 0x1e) {
      bVar6 = 0;
      lVar7 = 0;
      uVar5 = 0;
      do {
        uVar8 = 0;
        if ((uVar4 >> ((uint)lVar7 & 0x1f) & 1) != 0) {
          uVar8 = 0xffL << (bVar6 & 0x3f);
        }
        uVar5 = uVar5 | uVar8;
        lVar7 = lVar7 + 1;
        bVar6 = bVar6 + 8;
      } while (lVar7 != 8);
      goto LAB_0015e1f2;
    }
    uVar5 = 0;
  }
  fmt = "#%lu";
LAB_0015e26e:
  SStream_concat((SStream *)CONCAT44(in_register_00000034,OpNum),fmt,uVar5);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x02';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).arm.op_count * 0x28 + 0x46) = (int)uVar5;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  return;
}

Assistant:

static void printNEONModImmOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned EncodedImm = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNum));
	unsigned EltBits;
	uint64_t Val = ARM_AM_decodeNEONModImm(EncodedImm, &EltBits);
	if (Val > HEX_THRESHOLD)
		SStream_concat(O, "#0x%"PRIx64, Val);
	else
		SStream_concat(O, "#%"PRIu64, Val);
	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_IMM;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].imm = (unsigned int)Val;
		MI->flat_insn->detail->arm.op_count++;
	}
}